

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

bool __thiscall
ON_RenderContent::SetChildSlotAmount(ON_RenderContent *this,double amount,wchar_t *child_slot_name)

{
  int iVar1;
  wchar_t *pwVar2;
  ON_XMLVariant local_138;
  ON_wString local_30;
  ON_wString local_28;
  ON_wString s;
  wchar_t *child_slot_name_local;
  double amount_local;
  ON_RenderContent *this_local;
  
  s.m_s = child_slot_name;
  ON_wString::ON_wString(&local_30,child_slot_name);
  ON_wString::operator+(&local_28,(wchar_t *)&local_30);
  ON_wString::~ON_wString(&local_30);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_28);
  ::ON_XMLVariant::ON_XMLVariant(&local_138,amount / 100.0);
  iVar1 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2e])
                    (this,pwVar2,&local_138);
  ::ON_XMLVariant::~ON_XMLVariant(&local_138);
  ON_wString::~ON_wString(&local_28);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool ON_RenderContent::SetChildSlotAmount(double amount, const wchar_t* child_slot_name)
{
  const auto s = ON_wString(child_slot_name) + L"-" MAT_POSTFIX_DOUBLE_AMOUNT;

  return SetParameter(s, amount / 100.0);
}